

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_coarsen_topology.cpp
# Opt level: O3

void Omega_h::mark_dead_ents
               (Mesh *mesh,LOs *rails2edges,Read<signed_char> *rail_col_dirs,Int cell_dim,
               Write<signed_char> *dead_cells,Write<signed_char> *dead_sides)

{
  int *piVar1;
  int iVar2;
  ulong uVar3;
  long lVar4;
  long lVar5;
  uint uVar6;
  int iVar7;
  Alloc *this;
  long lVar8;
  uint uVar9;
  int iVar10;
  uint uVar11;
  Alloc *this_00;
  char cVar12;
  Alloc *this_01;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  Read<signed_char> ec_codes;
  LOs ec2c;
  LOs e2ec;
  type f;
  Adj e2c;
  Alloc *local_298;
  int local_278;
  Alloc *local_218;
  void *pvStack_210;
  Alloc *local_208;
  void *pvStack_200;
  Alloc *local_1f8;
  void *pvStack_1f0;
  Alloc *local_1e8;
  void *pvStack_1e0;
  Alloc *local_1d8;
  void *pvStack_1d0;
  Int local_1c8;
  Alloc *local_1c0;
  void *pvStack_1b8;
  int local_1b0;
  Alloc *local_1a8;
  void *pvStack_1a0;
  Alloc *local_198;
  void *pvStack_190;
  Adj local_180;
  Alloc *local_150;
  void *local_148;
  Alloc *local_140;
  void *local_138;
  Int local_130;
  Alloc *local_128;
  void *local_120;
  int local_118;
  Alloc *local_110;
  void *local_108;
  Alloc *local_100;
  void *local_f8;
  Alloc *local_f0;
  void *local_e8;
  Alloc *local_e0;
  void *local_d8;
  Alloc *local_d0;
  void *local_c8;
  Alloc *local_c0;
  void *local_b8;
  Alloc *local_b0;
  void *local_a8;
  Int local_a0;
  Alloc *local_98;
  void *local_90;
  int local_88;
  Alloc *local_80;
  void *local_78;
  Alloc *local_70;
  void *local_68;
  Adj local_60;
  
  Mesh::ask_up(&local_60,mesh,1,cell_dim);
  this_00 = local_60.super_Graph.a2ab.write_.shared_alloc_.alloc;
  if (((ulong)local_60.super_Graph.a2ab.write_.shared_alloc_.alloc & 7) == 0 &&
      local_60.super_Graph.a2ab.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      this_00 = (Alloc *)((local_60.super_Graph.a2ab.write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_60.super_Graph.a2ab.write_.shared_alloc_.alloc)->use_count =
           (local_60.super_Graph.a2ab.write_.shared_alloc_.alloc)->use_count + 1;
    }
  }
  this = local_60.super_Graph.ab2b.write_.shared_alloc_.alloc;
  if (((ulong)local_60.super_Graph.ab2b.write_.shared_alloc_.alloc & 7) == 0 &&
      local_60.super_Graph.ab2b.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      this = (Alloc *)((local_60.super_Graph.ab2b.write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_60.super_Graph.ab2b.write_.shared_alloc_.alloc)->use_count =
           (local_60.super_Graph.ab2b.write_.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_298 = local_60.codes.write_.shared_alloc_.alloc;
  if (((ulong)local_60.codes.write_.shared_alloc_.alloc & 7) == 0 &&
      local_60.codes.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_298 = (Alloc *)((local_60.codes.write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_60.codes.write_.shared_alloc_.alloc)->use_count =
           (local_60.codes.write_.shared_alloc_.alloc)->use_count + 1;
    }
  }
  Mesh::ask_down(&local_180,mesh,cell_dim,cell_dim + -1);
  local_90 = local_180.super_Graph.ab2b.write_.shared_alloc_.direct_ptr;
  this_01 = local_180.super_Graph.ab2b.write_.shared_alloc_.alloc;
  if ((((ulong)local_180.super_Graph.ab2b.write_.shared_alloc_.alloc & 7) == 0 &&
       local_180.super_Graph.ab2b.write_.shared_alloc_.alloc != (Alloc *)0x0) &&
     (entering_parallel == '\x01')) {
    (local_180.super_Graph.ab2b.write_.shared_alloc_.alloc)->use_count =
         (local_180.super_Graph.ab2b.write_.shared_alloc_.alloc)->use_count + -1;
    this_01 = (Alloc *)((local_180.super_Graph.ab2b.write_.shared_alloc_.alloc)->size * 8 + 1);
  }
  local_180.super_Graph.ab2b.write_.shared_alloc_.alloc = (Alloc *)0x0;
  local_180.super_Graph.ab2b.write_.shared_alloc_.direct_ptr = (void *)0x0;
  Adj::~Adj(&local_180);
  local_1b0 = -1;
  if ((uint)cell_dim < 4) {
    local_1b0 = cell_dim + 1;
  }
  local_f0 = (rails2edges->write_).shared_alloc_.alloc;
  if (((ulong)local_f0 & 1) == 0) {
    uVar3 = local_f0->size;
  }
  else {
    uVar3 = (ulong)local_f0 >> 3;
  }
  if (((ulong)local_f0 & 7) == 0 && local_f0 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_f0 = (Alloc *)(local_f0->size * 8 + 1);
    }
    else {
      local_f0->use_count = local_f0->use_count + 1;
    }
  }
  local_e8 = (rails2edges->write_).shared_alloc_.direct_ptr;
  local_e0 = (rail_col_dirs->write_).shared_alloc_.alloc;
  if (((ulong)local_e0 & 7) == 0 && local_e0 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_e0 = (Alloc *)(local_e0->size * 8 + 1);
    }
    else {
      local_e0->use_count = local_e0->use_count + 1;
    }
  }
  local_d8 = (rail_col_dirs->write_).shared_alloc_.direct_ptr;
  bVar13 = ((ulong)this_00 & 7) == 0;
  local_d0 = this_00;
  if (bVar13 && this_00 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_d0 = (Alloc *)(this_00->size * 8 + 1);
    }
    else {
      this_00->use_count = this_00->use_count + 1;
    }
  }
  local_c8 = local_60.super_Graph.a2ab.write_.shared_alloc_.direct_ptr;
  bVar14 = ((ulong)this & 7) == 0;
  local_c0 = this;
  if (bVar14 && this != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_c0 = (Alloc *)(this->size * 8 + 1);
    }
    else {
      this->use_count = this->use_count + 1;
    }
  }
  local_b8 = local_60.super_Graph.ab2b.write_.shared_alloc_.direct_ptr;
  local_b0 = local_298;
  bVar15 = ((ulong)local_298 & 7) == 0;
  if (bVar15 && local_298 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_b0 = (Alloc *)(local_298->size * 8 + 1);
    }
    else {
      local_298->use_count = local_298->use_count + 1;
    }
  }
  local_a8 = local_60.codes.write_.shared_alloc_.direct_ptr;
  bVar16 = ((ulong)this_01 & 7) == 0;
  local_98 = this_01;
  if (bVar16 && this_01 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_98 = (Alloc *)(this_01->size * 8 + 1);
    }
    else {
      this_01->use_count = this_01->use_count + 1;
    }
  }
  local_80 = (dead_cells->shared_alloc_).alloc;
  if (((ulong)local_80 & 7) == 0 && local_80 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_80 = (Alloc *)(local_80->size * 8 + 1);
    }
    else {
      local_80->use_count = local_80->use_count + 1;
    }
  }
  local_78 = (dead_cells->shared_alloc_).direct_ptr;
  local_70 = (dead_sides->shared_alloc_).alloc;
  if (((ulong)local_70 & 7) == 0 && local_70 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_70 = (Alloc *)(local_70->size * 8 + 1);
    }
    else {
      local_70->use_count = local_70->use_count + 1;
    }
  }
  local_68 = (dead_sides->shared_alloc_).direct_ptr;
  local_218 = local_f0;
  if (((ulong)local_f0 & 7) == 0 && local_f0 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_218 = (Alloc *)(local_f0->size * 8 + 1);
    }
    else {
      local_f0->use_count = local_f0->use_count + 1;
    }
  }
  local_208 = local_e0;
  if (((ulong)local_e0 & 7) == 0 && local_e0 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_208 = (Alloc *)(local_e0->size * 8 + 1);
    }
    else {
      local_e0->use_count = local_e0->use_count + 1;
    }
  }
  local_1f8 = local_d0;
  if (((ulong)local_d0 & 7) == 0 && local_d0 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_1f8 = (Alloc *)(local_d0->size * 8 + 1);
    }
    else {
      local_d0->use_count = local_d0->use_count + 1;
    }
  }
  pvStack_1f0 = local_60.super_Graph.a2ab.write_.shared_alloc_.direct_ptr;
  local_1e8 = local_c0;
  if (((ulong)local_c0 & 7) == 0 && local_c0 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_1e8 = (Alloc *)(local_c0->size * 8 + 1);
    }
    else {
      local_c0->use_count = local_c0->use_count + 1;
    }
  }
  pvStack_1e0 = local_60.super_Graph.ab2b.write_.shared_alloc_.direct_ptr;
  local_1d8 = local_b0;
  if (((ulong)local_b0 & 7) == 0 && local_b0 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_1d8 = (Alloc *)(local_b0->size * 8 + 1);
    }
    else {
      local_b0->use_count = local_b0->use_count + 1;
    }
  }
  pvStack_1d0 = local_60.codes.write_.shared_alloc_.direct_ptr;
  local_1c0 = local_98;
  if (((ulong)local_98 & 7) == 0 && local_98 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_1c0 = (Alloc *)(local_98->size * 8 + 1);
    }
    else {
      local_98->use_count = local_98->use_count + 1;
    }
  }
  pvStack_1b8 = local_90;
  local_1a8 = local_80;
  if (((ulong)local_80 & 7) == 0 && local_80 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_1a8 = (Alloc *)(local_80->size * 8 + 1);
    }
    else {
      local_80->use_count = local_80->use_count + 1;
    }
  }
  local_198 = local_70;
  if (((ulong)local_70 & 7) == 0 && local_70 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_198 = (Alloc *)(local_70->size * 8 + 1);
    }
    else {
      local_70->use_count = local_70->use_count + 1;
    }
  }
  local_278 = (int)(uVar3 >> 2);
  pvStack_210 = local_e8;
  pvStack_200 = local_d8;
  local_1c8 = cell_dim;
  pvStack_1a0 = local_78;
  pvStack_190 = local_68;
  local_a0 = cell_dim;
  local_88 = local_1b0;
  if (0 < local_278) {
    local_180.super_Graph.a2ab.write_.shared_alloc_.alloc = local_218;
    if (((ulong)local_218 & 7) == 0 && local_218 != (Alloc *)0x0) {
      local_218->use_count = local_218->use_count + -1;
      local_180.super_Graph.a2ab.write_.shared_alloc_.alloc = (Alloc *)(local_218->size * 8 + 1);
    }
    local_218 = (Alloc *)0x0;
    pvStack_210 = (void *)0x0;
    local_180.super_Graph.ab2b.write_.shared_alloc_.alloc = local_208;
    if (((ulong)local_208 & 7) == 0 && local_208 != (Alloc *)0x0) {
      local_208->use_count = local_208->use_count + -1;
      local_180.super_Graph.ab2b.write_.shared_alloc_.alloc = (Alloc *)(local_208->size * 8 + 1);
    }
    local_208 = (Alloc *)0x0;
    pvStack_200 = (void *)0x0;
    local_180.codes.write_.shared_alloc_.alloc = local_1f8;
    local_180.codes.write_.shared_alloc_.direct_ptr =
         local_60.super_Graph.a2ab.write_.shared_alloc_.direct_ptr;
    if (((ulong)local_1f8 & 7) == 0 && local_1f8 != (Alloc *)0x0) {
      local_1f8->use_count = local_1f8->use_count + -1;
      local_180.codes.write_.shared_alloc_.alloc = (Alloc *)(local_1f8->size * 8 + 1);
    }
    local_1f8 = (Alloc *)0x0;
    pvStack_1f0 = (void *)0x0;
    local_150 = local_1e8;
    local_148 = local_60.super_Graph.ab2b.write_.shared_alloc_.direct_ptr;
    if (((ulong)local_1e8 & 7) == 0 && local_1e8 != (Alloc *)0x0) {
      local_1e8->use_count = local_1e8->use_count + -1;
      local_150 = (Alloc *)(local_1e8->size * 8 + 1);
    }
    local_1e8 = (Alloc *)0x0;
    pvStack_1e0 = (void *)0x0;
    local_140 = local_1d8;
    local_138 = local_60.codes.write_.shared_alloc_.direct_ptr;
    if (((ulong)local_1d8 & 7) == 0 && local_1d8 != (Alloc *)0x0) {
      local_1d8->use_count = local_1d8->use_count + -1;
      local_140 = (Alloc *)(local_1d8->size * 8 + 1);
    }
    local_1d8 = (Alloc *)0x0;
    pvStack_1d0 = (void *)0x0;
    local_120 = local_90;
    local_128 = local_1c0;
    if (((ulong)local_1c0 & 7) == 0 && local_1c0 != (Alloc *)0x0) {
      local_1c0->use_count = local_1c0->use_count + -1;
      local_128 = (Alloc *)(local_1c0->size * 8 + 1);
    }
    local_1c0 = (Alloc *)0x0;
    pvStack_1b8 = (void *)0x0;
    local_110 = local_1a8;
    if (((ulong)local_1a8 & 7) == 0 && local_1a8 != (Alloc *)0x0) {
      local_1a8->use_count = local_1a8->use_count + -1;
      local_110 = (Alloc *)(local_1a8->size * 8 + 1);
    }
    local_1a8 = (Alloc *)0x0;
    pvStack_1a0 = (void *)0x0;
    local_100 = local_198;
    if (((ulong)local_198 & 7) == 0 && local_198 != (Alloc *)0x0) {
      local_198->use_count = local_198->use_count + -1;
      local_100 = (Alloc *)(local_198->size * 8 + 1);
    }
    local_198 = (Alloc *)0x0;
    pvStack_190 = (void *)0x0;
    entering_parallel = '\0';
    lVar8 = 0;
    do {
      lVar4 = (long)*(int *)((long)local_e8 + lVar8 * 4);
      iVar2 = *(int *)((long)local_60.super_Graph.a2ab.write_.shared_alloc_.direct_ptr + lVar4 * 4);
      lVar5 = (long)iVar2;
      if (iVar2 < *(int *)((long)local_60.super_Graph.a2ab.write_.shared_alloc_.direct_ptr +
                          lVar4 * 4 + 4)) {
        uVar11 = 1 - (int)*(char *)((long)local_d8 + lVar8);
        do {
          iVar2 = *(int *)((long)local_60.super_Graph.ab2b.write_.shared_alloc_.direct_ptr +
                          lVar5 * 4);
          if (cell_dim == 1) {
            iVar7 = 2;
            goto LAB_002624c5;
          }
          cVar12 = (char)*(byte *)((long)local_60.codes.write_.shared_alloc_.direct_ptr + lVar5) >>
                   3;
          uVar6 = *(byte *)((long)local_60.codes.write_.shared_alloc_.direct_ptr + lVar5) >> 1 & 3;
          uVar9 = uVar11 ^ uVar6;
          if (cell_dim == 2) {
            if (cVar12 == '\x02') {
              iVar7 = 0;
              if (uVar11 != uVar6) {
                iVar7 = 1;
LAB_0026249f:
                if (uVar9 != 1) goto switchD_002623f1_default;
              }
            }
            else {
              if (cVar12 == '\x01') goto switchD_002623f1_caseD_3;
              if (cVar12 == '\0') {
                iVar7 = (uint)(uVar9 == 1) * 3 + -1;
                goto LAB_002624b8;
              }
switchD_002623f1_default:
              iVar7 = -1;
            }
            goto LAB_002624c5;
          }
          iVar7 = -1;
          if (cell_dim != 3) goto LAB_002624c5;
          switch(cVar12) {
          case '\0':
            iVar7 = (uint)(uVar9 == 1) * 4 + -1;
            break;
          case '\x01':
            iVar7 = (uint)(uVar9 == 1) * 2 + -1;
            goto LAB_00262485;
          case '\x02':
            iVar7 = 1;
            if (uVar11 != uVar6) {
              iVar7 = 2;
              goto LAB_0026249f;
            }
            goto LAB_002624c5;
          case '\x03':
switchD_002623f1_caseD_3:
            iVar7 = -(uint)(uVar9 != 1);
            break;
          case '\x04':
            iVar7 = -(uint)(uVar9 != 1);
LAB_00262485:
            iVar10 = 3;
            goto LAB_002624c1;
          case '\x05':
            iVar7 = -(uint)(uVar9 != 1);
LAB_002624b8:
            iVar10 = 1;
            goto LAB_002624c1;
          default:
            goto switchD_002623f1_default;
          }
          iVar10 = 2;
LAB_002624c1:
          if (uVar11 == uVar6) {
            iVar7 = iVar10;
          }
LAB_002624c5:
          iVar7 = *(int *)((long)local_90 + (long)(iVar2 * local_1b0 + iVar7) * 4);
          *(undefined1 *)((long)local_78 + (long)iVar2) = 1;
          *(undefined1 *)((long)local_68 + (long)iVar7) = 1;
          lVar5 = lVar5 + 1;
        } while (lVar5 < *(int *)((long)local_60.super_Graph.a2ab.write_.shared_alloc_.direct_ptr +
                                 lVar4 * 4 + 4));
      }
      lVar8 = lVar8 + 1;
    } while ((int)lVar8 != local_278);
    local_180.super_Graph.a2ab.write_.shared_alloc_.direct_ptr = local_e8;
    local_180.super_Graph.ab2b.write_.shared_alloc_.direct_ptr = local_d8;
    local_130 = cell_dim;
    local_118 = local_1b0;
    local_108 = local_78;
    local_f8 = local_68;
    mark_dead_ents(Omega_h::Mesh*,Omega_h::Read<int>,Omega_h::Read<signed_char>,int,Omega_h::Write<signed_char>&,Omega_h::Write<signed_char>&)
    ::$_0::~__0((__0 *)&local_180);
  }
  mark_dead_ents(Omega_h::Mesh*,Omega_h::Read<int>,Omega_h::Read<signed_char>,int,Omega_h::Write<signed_char>&,Omega_h::Write<signed_char>&)
  ::$_0::~__0((__0 *)&local_218);
  mark_dead_ents(Omega_h::Mesh*,Omega_h::Read<int>,Omega_h::Read<signed_char>,int,Omega_h::Write<signed_char>&,Omega_h::Write<signed_char>&)
  ::$_0::~__0((__0 *)&local_f0);
  if (bVar16 && this_01 != (Alloc *)0x0) {
    piVar1 = &this_01->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(this_01);
      operator_delete(this_01,0x48);
    }
  }
  if (bVar15 && local_298 != (Alloc *)0x0) {
    piVar1 = &local_298->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_298);
      operator_delete(local_298,0x48);
    }
  }
  if (bVar14 && this != (Alloc *)0x0) {
    piVar1 = &this->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(this);
      operator_delete(this,0x48);
    }
  }
  if (bVar13 && this_00 != (Alloc *)0x0) {
    piVar1 = &this_00->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(this_00);
      operator_delete(this_00,0x48);
    }
  }
  Adj::~Adj(&local_60);
  return;
}

Assistant:

void mark_dead_ents(Mesh* mesh, LOs rails2edges, Read<I8> rail_col_dirs,
    Int cell_dim, Write<I8>& dead_cells, Write<I8>& dead_sides) {
  auto e2c = mesh->ask_up(EDGE, cell_dim);
  auto e2ec = e2c.a2ab;
  auto ec2c = e2c.ab2b;
  auto ec_codes = e2c.codes;
  auto cs2s = mesh->ask_down(cell_dim, cell_dim - 1).ab2b;
  auto nccs = simplex_degree(cell_dim, cell_dim - 1);
  auto nrails = rails2edges.size();
  auto f = OMEGA_H_LAMBDA(LO rail) {
    auto e = rails2edges[rail];
    auto eev_col = rail_col_dirs[rail];
    auto eev_onto = 1 - eev_col;
    for (auto ec = e2ec[e]; ec < e2ec[e + 1]; ++ec) {
      auto c = ec2c[ec];
      auto ec_code = ec_codes[ec];
      auto cce = code_which_down(ec_code);
      auto rot = code_rotation(ec_code);
      auto cev_onto = rot ^ eev_onto;
      auto ccv_onto = simplex_down_template(cell_dim, EDGE, cce, cev_onto);
      auto ccs_opp = simplex_opposite_template(cell_dim, VERT, ccv_onto);
      auto s_opp = cs2s[c * nccs + ccs_opp];
      dead_cells[c] = 1;
      dead_sides[s_opp] = 1;
    }
  };
  parallel_for(nrails, f, "mark_dead_ents");
}